

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O2

bool __thiscall test_CESkyCoord::test_Convert2Observed(test_CESkyCoord *this)

{
  CEDate *date;
  CEObserver *observer;
  CESkyCoord *this_00;
  undefined1 uVar1;
  double date_00;
  CESkyCoord ecl2obs;
  CESkyCoord obs2obs;
  CESkyCoord gal2obs;
  CESkyCoord icrs2obs;
  CESkyCoord testobs;
  CESkyCoord cirs2obs;
  allocator local_215;
  undefined4 local_214;
  CEDate local_210;
  CEObserver local_1d0;
  CESkyCoord local_120;
  CESkyCoord local_f0;
  CESkyCoord local_c0;
  CESkyCoord local_90;
  CESkyCoord local_60;
  
  CESkyCoord::CESkyCoord(&local_90);
  date = &this->base_date_;
  observer = &this->base_observer_;
  CESkyCoord::ConvertToObserved(&local_60,&this->base_cirs_,date,observer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_c0);
  this_00 = &this->base_obs_;
  local_210._vptr_CEDate._0_4_ = 0x138;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c0);
  CESkyCoord::CIRS2Observed
            (&this->base_cirs_,&local_90,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_c0);
  local_210._vptr_CEDate._0_4_ = 0x13b;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c0);
  CESkyCoord::ConvertToObserved(&local_c0,&this->base_icrs_,date,observer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_f0);
  local_210._vptr_CEDate._0_4_ = 0x13f;
  (**(code **)(*(long *)this + 200))(this,&local_c0,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_f0);
  CESkyCoord::ICRS2Observed
            (&this->base_icrs_,&local_90,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_f0);
  local_210._vptr_CEDate._0_4_ = 0x142;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_f0);
  CESkyCoord::ConvertToObserved(&local_f0,&this->base_gal_,date,observer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_120)
  ;
  local_210._vptr_CEDate._0_4_ = 0x146;
  (**(code **)(*(long *)this + 200))(this,&local_f0,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_120);
  CESkyCoord::Galactic2Observed
            (&this->base_gal_,&local_90,date,observer,(CESkyCoord *)0x0,(CEAngle *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_120)
  ;
  local_210._vptr_CEDate._0_4_ = 0x149;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_120);
  date_00 = CEDate::CurrentJD();
  CEDate::CEDate(&local_210,date_00,JD);
  CEObserver::CEObserver(&local_1d0);
  CESkyCoord::ConvertToObserved(&local_120,this_00,&local_210,&local_1d0);
  CEObserver::~CEObserver(&local_1d0);
  CEDate::~CEDate(&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_Convert2Observed",(allocator *)&local_214)
  ;
  local_210._vptr_CEDate._0_4_ = 0x14d;
  (**(code **)(*(long *)this + 200))(this,&local_120,this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_214);
  CESkyCoord::ConvertToObserved((CESkyCoord *)&local_1d0,&this->base_ecl_,date,observer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"test_Convert2Observed",&local_215);
  local_214 = 0x151;
  (**(code **)(*(long *)this + 200))(this,&local_1d0,this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_215);
  CESkyCoord::Ecliptic2Observed(&this->base_ecl_,(CESkyCoord *)&local_1d0,date,observer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"test_Convert2Observed",&local_215);
  local_214 = 0x154;
  (**(code **)(*(long *)this + 200))(this,&local_1d0,this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_215);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CESkyCoord::~CESkyCoord((CESkyCoord *)&local_1d0);
  CESkyCoord::~CESkyCoord(&local_120);
  CESkyCoord::~CESkyCoord(&local_f0);
  CESkyCoord::~CESkyCoord(&local_c0);
  CESkyCoord::~CESkyCoord(&local_60);
  CESkyCoord::~CESkyCoord(&local_90);
  return (bool)uVar1;
}

Assistant:

bool test_CESkyCoord::test_Convert2Observed()
{
    // Preliminary variable for observer based conversion
    CESkyCoord testobs;

    // CIRS -> Observed
    CESkyCoord cirs2obs = base_cirs_.ConvertToObserved(base_date_, base_observer_);
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::CIRS2Observed(base_cirs_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // ICRS -> Observed
    CESkyCoord icrs2obs = base_icrs_.ConvertToObserved(base_date_, base_observer_);
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::ICRS2Observed(base_icrs_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Galactic -> Observed
    CESkyCoord gal2obs = base_gal_.ConvertToObserved(base_date_, base_observer_);
    test_coords(gal2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::Galactic2Observed(base_gal_, &testobs, base_date_, base_observer_);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Observed -> Observed
    CESkyCoord obs2obs = base_obs_.ConvertToObserved();
    test_coords(obs2obs, base_obs_, __func__, __LINE__);

    // Ecliptic -> Observed
    CESkyCoord ecl2obs = base_ecl_.ConvertToObserved(base_date_, base_observer_);
    test_coords(ecl2obs, base_obs_, __func__, __LINE__);

    CESkyCoord::Ecliptic2Observed(base_ecl_, &ecl2obs, base_date_, base_observer_);
    test_coords(ecl2obs, base_obs_, __func__, __LINE__);

    return pass();
}